

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sunlinsol_spbcgs.c
# Opt level: O3

SUNErrCode SUNLinSolSetATimes_SPBCGS(SUNLinearSolver S,void *ATData,SUNATimesFn ATimes)

{
  void *pvVar1;
  
  pvVar1 = S->content;
  *(SUNATimesFn *)((long)pvVar1 + 0x20) = ATimes;
  *(void **)((long)pvVar1 + 0x28) = ATData;
  return 0;
}

Assistant:

SUNErrCode SUNLinSolSetATimes_SPBCGS(SUNLinearSolver S, void* ATData,
                                     SUNATimesFn ATimes)
{
  SUNFunctionBegin(S->sunctx);
  /* set function pointers to integrator-supplied ATimes routine
     and data, and return with success */
  SPBCGS_CONTENT(S)->ATimes = ATimes;
  SPBCGS_CONTENT(S)->ATData = ATData;
  return SUN_SUCCESS;
}